

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O1

int __thiscall
adios2::helper::CommImplMPI::Win_lock
          (CommImplMPI *this,LockType lock_type,int rank,int assert,Win *win,string *hint)

{
  int value;
  undefined8 uVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = adios2::helper::CommWinImpl::Get(win);
  lVar2 = __dynamic_cast(uVar1,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  value = MPI_Win_lock(*(undefined4 *)
                        ((long)&(anonymous_namespace)::LockTypeToMPI + (long)(int)lock_type * 4),
                       rank,assert,*(undefined8 *)(lVar2 + 8));
  std::operator+(&local_40,"in call to Win_Lock ",hint);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar3[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_60._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  anon_unknown_1::CheckMPIReturn(value,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return value;
}

Assistant:

int CommImplMPI::Win_lock(Comm::LockType lock_type, int rank, int assert, Comm::Win &win,
                          const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    int mpi_lock_type = ToMPI(lock_type);
    int ret = MPI_Win_lock(mpi_lock_type, rank, assert, w->m_Win);
    CheckMPIReturn(ret, "in call to Win_Lock " + hint + "\n");
    return ret;
}